

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.hpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::XMLURL::getURLText(XMLURL *this)

{
  XMLURL *this_local;
  
  if (*(long *)(this + 0x48) == 0) {
    xercesc_4_0::XMLURL::buildFullText();
  }
  return *(XMLCh **)(this + 0x48);
}

Assistant:

inline const XMLCh* XMLURL::getURLText() const
{
    //
    //  Fault it in if not already. Since this is a const method and we
    //  can't use mutable members due the compilers we have to support,
    //  we have to cast off the constness.
    //
    if (!fURLText)
        ((XMLURL*)this)->buildFullText();

    return fURLText;
}